

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_elements_transaction.cpp
# Opt level: O2

uint32_t __thiscall
cfd::ConfidentialTransactionController::GetSizeIgnoreTxIn
          (ConfidentialTransactionController *this,bool is_blinded,uint32_t *witness_area_size,
          uint32_t *no_witness_area_size,int exponent,int minimum_bits)

{
  byte bVar1;
  char cVar2;
  int iVar3;
  long lVar4;
  undefined7 in_register_00000031;
  ConfidentialTxOutReference *txout;
  int iVar5;
  uint32_t temp_no_witness_size;
  undefined4 local_94;
  int local_90;
  uint local_8c;
  uint32_t *local_88;
  uint32_t *local_80;
  uint32_t temp_witness_size;
  vector<cfd::core::ConfidentialTxInReference,_std::allocator<cfd::core::ConfidentialTxInReference>_>
  txins;
  long local_58;
  vector<cfd::core::ConfidentialTxOutReference,_std::allocator<cfd::core::ConfidentialTxOutReference>_>
  txouts;
  long local_40;
  
  local_94 = (undefined4)CONCAT71(in_register_00000031,is_blinded);
  local_90 = exponent;
  local_8c = minimum_bits;
  local_88 = witness_area_size;
  local_80 = no_witness_area_size;
  cfd::core::ConfidentialTransaction::GetTxOutList();
  cfd::core::ConfidentialTransaction::GetTxInList();
  for (lVar4 = _txins; lVar4 != local_58; lVar4 = lVar4 + 0x160) {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&temp_witness_size,
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *)(lVar4 + 0xa8));
    cVar2 = cfd::core::ByteData256::IsEmpty();
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&temp_witness_size);
    if (cVar2 == '\0') {
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&temp_witness_size,
                 (vector<unsigned_char,_std::allocator<unsigned_char>_> *)(lVar4 + 0x90));
      cfd::core::ByteData256::IsEmpty();
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&temp_witness_size);
    }
  }
  temp_witness_size = 0;
  temp_no_witness_size = 0;
  iVar5 = 0;
  bVar1 = (byte)local_94;
  iVar3 = 0;
  for (lVar4 = _txouts; lVar4 != local_40; lVar4 = lVar4 + 0xf8) {
    cfd::core::ConfidentialTxOutReference::GetSerializeSize
              (SUB81(lVar4,0),(uint *)(ulong)bVar1,&temp_witness_size,(int)&temp_no_witness_size,
               local_90,(uint *)(ulong)local_8c,0);
    iVar5 = iVar5 + temp_witness_size;
    iVar3 = iVar3 + temp_no_witness_size;
  }
  if (local_88 != (uint32_t *)0x0) {
    *local_88 = *local_88 + iVar5;
  }
  if (local_80 != (uint32_t *)0x0) {
    *local_80 = *local_80 + iVar3 + 0xb;
  }
  std::
  vector<cfd::core::ConfidentialTxInReference,_std::allocator<cfd::core::ConfidentialTxInReference>_>
  ::~vector(&txins);
  std::
  vector<cfd::core::ConfidentialTxOutReference,_std::allocator<cfd::core::ConfidentialTxOutReference>_>
  ::~vector(&txouts);
  return iVar3 + 0xb + iVar5;
}

Assistant:

uint32_t ConfidentialTransactionController::GetSizeIgnoreTxIn(
    bool is_blinded, uint32_t* witness_area_size,
    uint32_t* no_witness_area_size, int exponent, int minimum_bits) const {
  uint32_t size = ConfidentialTransaction::kElementsTransactionMinimumSize;
  std::vector<ConfidentialTxOutReference> txouts = transaction_.GetTxOutList();
  std::vector<ConfidentialTxInReference> txins = transaction_.GetTxInList();

  uint32_t temp_asset_count = 0;

  // search vin from issue/reissue
  for (const auto& txin : txins) {
    if (!txin.GetAssetEntropy().IsEmpty()) {
      ++temp_asset_count;
      if (!txin.GetBlindingNonce().IsEmpty()) {
        // reissuance
      } else {
        ++temp_asset_count;  // issuance
      }
    }
    ++temp_asset_count;
  }

  uint32_t witness_size = 0;
  uint32_t no_witness_size = 0;
  uint32_t temp_witness_size = 0;
  uint32_t temp_no_witness_size = 0;
  for (const auto& txout : txouts) {
    txout.GetSerializeSize(
        is_blinded, &temp_witness_size, &temp_no_witness_size, exponent,
        minimum_bits, nullptr, temp_asset_count);
    witness_size += temp_witness_size;
    no_witness_size += temp_no_witness_size;
  }
  size += no_witness_size;

  if (witness_area_size != nullptr) {
    *witness_area_size += witness_size;
  }
  if (no_witness_area_size != nullptr) {
    *no_witness_area_size += size;
  }
  return size + witness_size;
}